

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::LegacyScriptPubKeyMan::LearnRelatedScripts
          (LegacyScriptPubKeyMan *this,CPubKey *key,OutputType type)

{
  char cVar1;
  long in_FS_OFFSET;
  CScript witprog;
  undefined1 local_90 [8];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_88;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (type == BECH32M) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x5d7,
                  "void wallet::LegacyScriptPubKeyMan::LearnRelatedScripts(const CPubKey &, OutputType)"
                 );
  }
  if ((type - P2SH_SEGWIT < 2) && ((key->vch[0] & 0xfe) == 2)) {
    CPubKey::GetID((CKeyID *)&local_68,key);
    local_68._M_index = '\x05';
    GetScriptForDestination((CScript *)(local_90 + 8),(CTxDestination *)&local_68);
    InferDescriptor((CScript *)local_90,(SigningProvider *)(local_90 + 8));
    if (local_90 != (undefined1  [8])0x0) {
      cVar1 = (**(code **)(*(long *)local_90 + 0x18))();
      if (cVar1 != '\0') {
        (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x24])
                  (this,local_90 + 8);
        if (local_90 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_90 + 8))();
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_90 + 8));
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage(&local_68);
        goto LAB_0095cfab;
      }
    }
    __assert_fail("desc && desc->IsSolvable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x5dd,
                  "void wallet::LegacyScriptPubKeyMan::LearnRelatedScripts(const CPubKey &, OutputType)"
                 );
  }
LAB_0095cfab:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::LearnRelatedScripts(const CPubKey& key, OutputType type)
{
    assert(type != OutputType::BECH32M);
    if (key.IsCompressed() && (type == OutputType::P2SH_SEGWIT || type == OutputType::BECH32)) {
        CTxDestination witdest = WitnessV0KeyHash(key.GetID());
        CScript witprog = GetScriptForDestination(witdest);
        // Make sure the resulting program is solvable.
        const auto desc = InferDescriptor(witprog, *this);
        assert(desc && desc->IsSolvable());
        AddCScript(witprog);
    }
}